

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

string * cmGlobalGhsMultiGenerator::TrimQuotes(string *__return_storage_ptr__,string *str)

{
  char local_19;
  string *local_18;
  string *str_local;
  
  local_19 = '\"';
  local_18 = str;
  str_local = __return_storage_ptr__;
  ::cm::erase<char,std::char_traits<char>,std::allocator<char>,char>(str,&local_19);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGhsMultiGenerator::TrimQuotes(std::string str)
{
  cm::erase(str, '"');
  return str;
}